

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy_auth(SessionHandle *data,connectdata *conn)

{
  char *pcVar1;
  char local_228 [8];
  char proxypasswd [256];
  char proxyuser [256];
  connectdata *conn_local;
  SessionHandle *data_local;
  
  memset(proxypasswd + 0xf8,0,0x100);
  memset(local_228,0,0x100);
  if ((data->set).str[0x1f] != (char *)0x0) {
    strncpy(proxypasswd + 0xf8,(data->set).str[0x1f],0x100);
  }
  if ((data->set).str[0x20] != (char *)0x0) {
    strncpy(local_228,(data->set).str[0x20],0x100);
    proxypasswd[0xf7] = '\0';
  }
  pcVar1 = curl_easy_unescape(data,proxypasswd + 0xf8,0,(int *)0x0);
  conn->proxyuser = pcVar1;
  if (conn->proxyuser == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar1 = curl_easy_unescape(data,local_228,0,(int *)0x0);
    conn->proxypasswd = pcVar1;
    if (conn->proxypasswd == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode parse_proxy_auth(struct SessionHandle *data,
                                 struct connectdata *conn)
{
  char proxyuser[MAX_CURL_USER_LENGTH]="";
  char proxypasswd[MAX_CURL_PASSWORD_LENGTH]="";

  if(data->set.str[STRING_PROXYUSERNAME] != NULL) {
    strncpy(proxyuser, data->set.str[STRING_PROXYUSERNAME],
            MAX_CURL_USER_LENGTH);
    proxyuser[MAX_CURL_USER_LENGTH-1] = '\0';   /*To be on safe side*/
  }
  if(data->set.str[STRING_PROXYPASSWORD] != NULL) {
    strncpy(proxypasswd, data->set.str[STRING_PROXYPASSWORD],
            MAX_CURL_PASSWORD_LENGTH);
    proxypasswd[MAX_CURL_PASSWORD_LENGTH-1] = '\0'; /*To be on safe side*/
  }

  conn->proxyuser = curl_easy_unescape(data, proxyuser, 0, NULL);
  if(!conn->proxyuser)
    return CURLE_OUT_OF_MEMORY;

  conn->proxypasswd = curl_easy_unescape(data, proxypasswd, 0, NULL);
  if(!conn->proxypasswd)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}